

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

LabelInstr * __thiscall Loop::GetLoopTopInstr(Loop *this)

{
  code *pcVar1;
  bool bVar2;
  BasicBlock *this_00;
  Instr *this_01;
  undefined4 *puVar3;
  LabelInstr *local_18;
  LabelInstr *instr;
  Loop *this_local;
  
  if ((*(uint *)&this->topFunc->field_0x240 >> 0x12 & 1) == 0) {
    local_18 = this->loopTopLabel;
  }
  else {
    this_00 = GetHeadBlock(this);
    this_01 = BasicBlock::GetFirstInstr(this_00);
    local_18 = IR::Instr::AsLabelInstr(this_01);
  }
  if ((local_18 != (LabelInstr *)0x0) && ((local_18->field_0x78 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xe3e,"(instr->m_isLoopTop)","instr->m_isLoopTop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return local_18;
}

Assistant:

IR::LabelInstr *
Loop::GetLoopTopInstr() const
{
    IR::LabelInstr * instr = nullptr;
    if (this->topFunc->isFlowGraphValid)
    {
        instr = this->GetHeadBlock()->GetFirstInstr()->AsLabelInstr();
    }
    else
    {
        // Flowgraph gets torn down after the globopt, so can't get the loopTop from the head block.
        instr = this->loopTopLabel;
    }
    if (instr)
    {
        Assert(instr->m_isLoopTop);
    }
    return instr;
}